

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::max(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  float fVar1;
  ulong uVar2;
  double dVar3;
  Literal local_28;
  
  uVar2 = (this->type).id;
  if (6 < uVar2) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  if ((int)uVar2 == 5) {
    if ((uVar2 != 5) || ((other->type).id != 5)) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x129,"double wasm::Literal::getf64() const");
    }
    local_28.field_0.i64 = *(undefined8 *)&this->field_0;
    if (NAN((double)local_28.field_0.i64)) {
      local_28.type.id = 5;
      standardizeNaN(__return_storage_ptr__,&local_28);
    }
    else {
      dVar3 = *(double *)&other->field_0;
      if (!NAN(dVar3)) {
        if ((((double)local_28.field_0.i64 != 0.0) || ((double)local_28.field_0.i64 != dVar3)) ||
           (NAN((double)local_28.field_0.i64) || NAN(dVar3))) {
          if (dVar3 <= (double)local_28.field_0.i64) {
            dVar3 = (double)local_28.field_0.i64;
          }
        }
        else if (-1 < local_28.field_0.i64) {
          dVar3 = (double)local_28.field_0.i64;
        }
        *(double *)&__return_storage_ptr__->field_0 = dVar3;
        (__return_storage_ptr__->type).id = 5;
        return __return_storage_ptr__;
      }
      local_28.type.id = 5;
      local_28.field_0._0_8_ = dVar3;
      standardizeNaN(__return_storage_ptr__,&local_28);
    }
  }
  else {
    if ((int)uVar2 != 4) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x603);
    }
    if ((uVar2 != 4) || ((other->type).id != 4)) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x125,"float wasm::Literal::getf32() const");
    }
    fVar1 = *(float *)&this->field_0;
    if (NAN(fVar1)) {
      local_28.field_0._0_4_ = fVar1;
      local_28.type.id = 4;
      standardizeNaN(__return_storage_ptr__,&local_28);
    }
    else {
      local_28.field_0.i32 = *(undefined4 *)&other->field_0;
      if (!NAN((float)local_28.field_0.i32)) {
        if (((fVar1 != 0.0) || (fVar1 != (float)local_28.field_0.i32)) ||
           (NAN(fVar1) || NAN((float)local_28.field_0.i32))) {
          if ((float)local_28.field_0.i32 <= fVar1) {
            local_28.field_0._0_4_ = fVar1;
          }
        }
        else if (-1 < (int)fVar1) {
          local_28.field_0._0_4_ = fVar1;
        }
        *(undefined4 *)&__return_storage_ptr__->field_0 = local_28.field_0.i32;
        (__return_storage_ptr__->type).id = 4;
        return __return_storage_ptr__;
      }
      local_28.type.id = 4;
      standardizeNaN(__return_storage_ptr__,&local_28);
    }
  }
  ~Literal(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::max(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32: {
      auto l = getf32(), r = other.getf32();
      if (std::isnan(l)) {
        return standardizeNaN(Literal(l));
      }
      if (std::isnan(r)) {
        return standardizeNaN(Literal(r));
      }
      if (l == r && l == 0) {
        return Literal(std::signbit(l) ? r : l);
      }
      return Literal(std::max(l, r));
    }
    case Type::f64: {
      auto l = getf64(), r = other.getf64();
      if (std::isnan(l)) {
        return standardizeNaN(Literal(l));
      }
      if (std::isnan(r)) {
        return standardizeNaN(Literal(r));
      }
      if (l == r && l == 0) {
        return Literal(std::signbit(l) ? r : l);
      }
      return Literal(std::max(l, r));
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}